

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::DEC_AB(CPU *this)

{
  byte bVar1;
  uint16_t address;
  ushort uVar2;
  uint16_t result;
  uint16_t addr;
  CPU *this_local;
  
  this->cycles = 6;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  uVar2 = bVar1 - 1;
  this->cycles = this->cycles - 1;
  WriteByte(this,address,(uint8_t)uVar2);
  (this->field_6).ps = (this->field_6).ps & 0xfd | (uVar2 == 0) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((uVar2 & 0x80) != 0 && -1 < (int)(uVar2 & 0x80)) << 7;
  return;
}

Assistant:

void CPU::DEC_AB()
{
    cycles = 6;
    uint16_t addr = GetWord(), result = ReadByte(addr) - 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}